

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall cli::Parser::enable_help(Parser *this)

{
  allocator local_b9;
  string local_b8 [32];
  anon_class_8_1_8991fb9c local_98;
  function<bool_(cli::CallbackArgs_&)> local_90;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"h",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"help",&local_69);
  local_98.this = this;
  std::function<bool(cli::CallbackArgs&)>::
  function<cli::Parser::enable_help()::_lambda(cli::CallbackArgs&)_1_,void>
            ((function<bool(cli::CallbackArgs&)> *)&local_90,&local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",&local_b9);
  set_callback<bool>(this,(string *)local_30,(string *)local_68,&local_90,(string *)local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::function<bool_(cli::CallbackArgs_&)>::~function(&local_90);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void enable_help() {
			set_callback("h", "help", std::function<bool(CallbackArgs&)>([this](CallbackArgs& args){
				args.output << this->usage();
				throw std::bad_cast();
				return false;
			}));
		}